

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O2

bool correctWidgetContext(ShortcutContext context,QWidget *w,QWidget *active_window)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  Data *pDVar4;
  long lVar5;
  QGraphicsWidget *w_00;
  bool bVar6;
  QMenuBar *pQVar7;
  QPlatformMenuBar *pQVar8;
  QObject *object;
  QWidgetWindow *pQVar9;
  QWidget *pQVar10;
  QWidget *pQVar11;
  uint uVar12;
  
  if (active_window == (QWidget *)0x0) {
    return false;
  }
  uVar3 = w->data->widget_attributes;
  pQVar7 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(&w->super_QObject);
  if ((pQVar7 == (QMenuBar *)0x0) ||
     (pQVar8 = QMenuBar::platformMenuBar(pQVar7), pQVar8 == (QPlatformMenuBar *)0x0)) {
LAB_0037f64e:
    if (-1 < (short)uVar3) {
      return false;
    }
  }
  else if (*(long *)(*(long *)&(pQVar7->super_QWidget).field_0x8 + 0x10) == 0) {
    object = (QObject *)(**(code **)(*(long *)pQVar8 + 0x80))(pQVar8);
    pQVar9 = QtPrivate::qobject_cast_helper<QWidgetWindow*,QObject>(object);
    if (pQVar9 == (QWidgetWindow *)0x0) {
      return false;
    }
    pDVar4 = (pQVar9->m_widget).wp.d;
    if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
      w = (QWidget *)0x0;
    }
    else {
      w = (QWidget *)(pQVar9->m_widget).wp.value;
    }
    goto LAB_0037f64e;
  }
  if ((w->data->widget_attributes & 1) != 0) {
    return false;
  }
  if (context == WidgetShortcut) {
    pQVar10 = QApplication::focusWidget();
    return w == pQVar10;
  }
  if (context == WidgetWithChildrenShortcut) {
    pQVar10 = QApplication::focusWidget();
    while( true ) {
      if (pQVar10 == (QWidget *)0x0) {
        return pQVar10 == w;
      }
      if (pQVar10 == w) {
        return pQVar10 == w;
      }
      uVar12 = (uint)(byte)(pQVar10->data->window_flags).
                           super_QFlagsStorageHelper<Qt::WindowType,_4>.
                           super_QFlagsStorage<Qt::WindowType>.i;
      if (0x12 < uVar12) {
        return false;
      }
      if ((0x40201U >> (uVar12 & 0x1f) & 1) == 0) break;
      pQVar10 = *(QWidget **)(*(long *)&pQVar10->field_0x8 + 0x10);
    }
    return false;
  }
  if (context == ApplicationShortcut) goto LAB_0037f674;
  pQVar10 = QWidget::window(w);
  lVar5 = *(long *)(*(long *)&pQVar10->field_0x8 + 0x78);
  if ((lVar5 != 0) && (w_00 = *(QGraphicsWidget **)(lVar5 + 0x10), w_00 != (QGraphicsWidget *)0x0))
  {
    bVar6 = correctGraphicsWidgetContext(context,w_00,active_window);
    return bVar6;
  }
  if (pQVar10 != active_window) {
    cVar1 = (char)(active_window->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                  super_QFlagsStorage<Qt::WindowType>.i;
    if (cVar1 == '\t') {
      pQVar11 = QWidget::focusProxy(active_window);
      if (pQVar11 != (QWidget *)0x0) {
        pQVar11 = QWidget::focusProxy(active_window);
        goto LAB_0037f752;
      }
    }
    else if ((cVar1 == '\v') &&
            (pQVar11 = *(QWidget **)(*(long *)&active_window->field_0x8 + 0x10),
            pQVar11 != (QWidget *)0x0)) {
LAB_0037f752:
      active_window = QWidget::window(pQVar11);
    }
  }
  pQVar11 = w;
  if ((active_window != pQVar10) &&
     (pQVar7 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(&pQVar10->super_QObject),
     pQVar7 == (QMenuBar *)0x0)) {
    return false;
  }
  for (; pQVar11 != (QWidget *)0x0; pQVar11 = *(QWidget **)(*(long *)&pQVar11->field_0x8 + 0x10)) {
    bVar2 = (byte)(pQVar11->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                  super_QFlagsStorage<Qt::WindowType>.i;
    if (bVar2 == 0x12) {
      for (pQVar10 = QApplication::focusWidget();
          (pQVar10 != (QWidget *)0x0 && (pQVar10 != pQVar11));
          pQVar10 = *(QWidget **)(*(long *)&pQVar10->field_0x8 + 0x10)) {
      }
      return pQVar11 == pQVar10;
    }
    if ((bVar2 & 1) != 0) break;
  }
LAB_0037f674:
  bVar6 = QApplicationPrivate::tryModalHelper(w,(QWidget **)0x0);
  return bVar6;
}

Assistant:

static bool correctWidgetContext(Qt::ShortcutContext context, QWidget *w, QWidget *active_window)
{
    if (!active_window)
        return false;

    bool visible = w->isVisible();
#if QT_CONFIG(menubar)
    if (auto menuBar = qobject_cast<QMenuBar *>(w)) {
        if (auto *pmb = menuBar->platformMenuBar()) {
            if (menuBar->parentWidget()) {
                visible = true;
            } else {
                if (auto *ww = qobject_cast<QWidgetWindow *>(pmb->parentWindow()))
                    w = ww->widget(); // Good enough since we only care about the window
                else
                    return false; // This is not a QWidget window. We won't deliver
            }
        }
    }
#endif

    if (!visible || !w->isEnabled())
        return false;

    if (context == Qt::ApplicationShortcut)
        return QApplicationPrivate::tryModalHelper(w, nullptr); // true, unless w is shadowed by a modal dialog

    if (context == Qt::WidgetShortcut)
        return w == QApplication::focusWidget();

    if (context == Qt::WidgetWithChildrenShortcut) {
        const QWidget *tw = QApplication::focusWidget();
        while (tw && tw != w && (tw->windowType() == Qt::Widget || tw->windowType() == Qt::Popup || tw->windowType() == Qt::SubWindow))
            tw = tw->parentWidget();
        return tw == w;
    }

    // Below is Qt::WindowShortcut context
    QWidget *tlw = w->window();
#if QT_CONFIG(graphicsview)
    if (auto topData = static_cast<QWidgetPrivate *>(QObjectPrivate::get(tlw))->extra.get()) {
        if (topData->proxyWidget) {
            bool res = correctGraphicsWidgetContext(context, topData->proxyWidget, active_window);
            return res;
        }
    }
#endif

    if (active_window && active_window != tlw) {
        /* if a floating tool window is active, keep shortcuts on the parent working.
         * and if a popup window is active (f.ex a completer), keep shortcuts on the
         * focus proxy working */
        if (active_window->windowType() == Qt::Tool && active_window->parentWidget()) {
            active_window = active_window->parentWidget()->window();
        } else if (active_window->windowType() == Qt::Popup && active_window->focusProxy()) {
            active_window = active_window->focusProxy()->window();
        }
    }

    if (active_window != tlw) {
#if QT_CONFIG(menubar)
        // If the tlw is a QMenuBar then we allow it to proceed as this indicates that
        // the QMenuBar is a parentless one and is therefore used for multiple top level
        // windows in the application. This is common on macOS platforms for example.
        if (!qobject_cast<QMenuBar *>(tlw))
#endif
        return false;
    }

    /* if we live in a MDI subwindow, ignore the event if we are
       not the active document window */
    const QWidget* sw = w;
    while (sw && !(sw->windowType() == Qt::SubWindow) && !sw->isWindow())
        sw = sw->parentWidget();
    if (sw && (sw->windowType() == Qt::SubWindow)) {
        QWidget *focus_widget = QApplication::focusWidget();
        while (focus_widget && focus_widget != sw)
            focus_widget = focus_widget->parentWidget();
        return sw == focus_widget;
    }

#if defined(DEBUG_QSHORTCUTMAP)
    qDebug().nospace() << "..true [Pass-through]";
#endif
    return QApplicationPrivate::tryModalHelper(w, nullptr);
}